

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkSpace.cc
# Opt level: O2

DistanceGraph * __thiscall
WorkSpace::add_distance_graph(WorkSpace *this,DistanceGraph *dg,string *name)

{
  __type _Var1;
  runtime_error *prVar2;
  pointer pbVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> n;
  
  if (0x1900 < (ulong)((long)(this->distance_graphs).
                             super__Vector_base<DistanceGraph,_std::allocator<DistanceGraph>_>.
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->distance_graphs).
                            super__Vector_base<DistanceGraph,_std::allocator<DistanceGraph>_>.
                            _M_impl.super__Vector_impl_data._M_start)) {
    prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (prVar2,
               "Maximum items exceeded, please increase MAX_WORKSPACE_VECTOR_SIZE compile option to add more items"
              );
    __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  list_distance_graphs_abi_cxx11_(&local_68,this);
  pbVar3 = local_68.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while( true ) {
    if (pbVar3 == local_68.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_68);
      std::vector<DistanceGraph,std::allocator<DistanceGraph>>::emplace_back<DistanceGraph_const&>
                ((vector<DistanceGraph,std::allocator<DistanceGraph>> *)&this->distance_graphs,dg);
      if (name->_M_string_length != 0) {
        std::__cxx11::string::_M_assign
                  ((string *)
                   &(this->distance_graphs).
                    super__Vector_base<DistanceGraph,_std::allocator<DistanceGraph>_>._M_impl.
                    super__Vector_impl_data._M_finish[-1].name);
      }
      return (this->distance_graphs).
             super__Vector_base<DistanceGraph,_std::allocator<DistanceGraph>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    }
    std::__cxx11::string::string((string *)&n,(string *)pbVar3);
    _Var1 = std::operator==(&n,name);
    if (_Var1) break;
    std::__cxx11::string::~string((string *)&n);
    pbVar3 = pbVar3 + 1;
  }
  prVar2 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar2,"Name is already in use");
  __cxa_throw(prVar2,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

DistanceGraph &WorkSpace::add_distance_graph(const DistanceGraph &dg, const std::string &name) {
    if (distance_graphs.size() > MAX_WORKSPACE_VECTOR_SIZE) {
        throw std::runtime_error("Maximum items exceeded, please increase MAX_WORKSPACE_VECTOR_SIZE compile option to add more items");
    }
    for (auto n:list_distance_graphs()) if (n==name) throw std::runtime_error("Name is already in use");
    distance_graphs.emplace_back(dg);
    if (!name.empty()) distance_graphs.back().name = name;
    return distance_graphs.back();
}